

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_message.cc
# Opt level: O1

void __thiscall
absl::lts_20250127::log_internal::LogMessage::LogMessageData::LogMessageData
          (LogMessageData *this,Nonnull<const_char_*> file,int line,LogSeverity severity,
          Time timestamp)

{
  long lVar1;
  bool bVar2;
  LogSeverity LVar3;
  pid_t pVar4;
  size_t sVar5;
  LogSeverity LVar6;
  long lVar7;
  long lVar8;
  
  (this->entry).timestamp_.rep_.rep_hi_.lo_ = 0;
  (this->entry).timestamp_.rep_.rep_hi_.hi_ = 0;
  (this->entry).timestamp_.rep_.rep_lo_ = 0;
  (this->entry).text_message_with_prefix_and_newline_and_nul_.ptr_ = (pointer)0x0;
  (this->entry).text_message_with_prefix_and_newline_and_nul_.len_ = 0;
  (this->entry).encoding_._M_len = 0;
  (this->entry).encoding_._M_str = (char *)0x0;
  (this->entry).full_filename_._M_len = 0;
  (this->entry).full_filename_._M_str = (char *)0x0;
  (this->entry).base_filename_._M_len = 0;
  (this->entry).base_filename_._M_str = (char *)0x0;
  (this->entry).stacktrace_._M_dataplus._M_p = (pointer)&(this->entry).stacktrace_.field_2;
  (this->entry).stacktrace_._M_string_length = 0;
  (this->entry).stacktrace_.field_2._M_local_buf[0] = '\0';
  (this->extra_sinks).storage_.metadata_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<std::allocator<absl::lts_20250127::LogSink_*>,_unsigned_long>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
  .super_Storage<unsigned_long,_1UL,_false>.value = 0;
  this->extra_sinks_only = false;
  std::ostream::ostream(&this->manipulated,(streambuf *)0x0);
  (this->encoded_remaining_actual_do_not_use_directly).ptr_ = (pointer)0x0;
  (this->encoded_remaining_actual_do_not_use_directly).len_ = 0;
  *(uint *)(&this->field_0x138 + *(long *)(*(long *)&this->manipulated + -0x18)) =
       *(uint *)(&this->field_0x138 + *(long *)(*(long *)&this->manipulated + -0x18)) | 0x201;
  sVar5 = strlen(file);
  (this->entry).full_filename_._M_len = sVar5;
  (this->entry).full_filename_._M_str = file;
  sVar5 = strlen(file);
  if (sVar5 == 0) {
LAB_002bbd35:
    lVar7 = 0;
  }
  else {
    lVar8 = sVar5 + 1;
    do {
      if (lVar8 == 1) goto LAB_002bbd35;
      lVar7 = lVar8 + -1;
      lVar1 = lVar8 + -2;
      lVar8 = lVar7;
    } while (file[lVar1] != '/');
  }
  (this->entry).base_filename_._M_len = sVar5 - lVar7;
  (this->entry).base_filename_._M_str = file + lVar7;
  (this->entry).line_ = line;
  bVar2 = ShouldPrependLogPrefix();
  (this->entry).prefix_ = bVar2;
  LVar3 = kInfo;
  if (0 < (int)severity) {
    LVar3 = severity;
  }
  LVar6 = kError;
  if ((int)severity < 4) {
    LVar6 = LVar3;
  }
  (this->entry).severity_ = LVar6;
  (this->entry).verbose_level_ = -1;
  (this->entry).timestamp_.rep_.rep_hi_ = timestamp.rep_.rep_hi_;
  (this->entry).timestamp_.rep_.rep_lo_ = timestamp.rep_.rep_lo_;
  pVar4 = base_internal::GetCachedTID();
  (this->entry).tid_ = pVar4;
  return;
}

Assistant:

LogMessage::LogMessageData::LogMessageData(absl::Nonnull<const char*> file,
                                           int line, absl::LogSeverity severity,
                                           absl::Time timestamp)
    : extra_sinks_only(false), manipulated(nullptr) {
  // Legacy defaults for LOG's ostream:
  manipulated.setf(std::ios_base::showbase | std::ios_base::boolalpha);
  entry.full_filename_ = file;
  entry.base_filename_ = Basename(file);
  entry.line_ = line;
  entry.prefix_ = absl::ShouldPrependLogPrefix();
  entry.severity_ = absl::NormalizeLogSeverity(severity);
  entry.verbose_level_ = absl::LogEntry::kNoVerbosityLevel;
  entry.timestamp_ = timestamp;
  entry.tid_ = absl::base_internal::GetCachedTID();
}